

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::syntactic::Scene::Scene(Scene *this)

{
  undefined8 *in_RDI;
  char (*__args) [7];
  
  *in_RDI = &PTR__Scene_0021a1a8;
  std::
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  ::vector((vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
            *)0x15f4ea);
  std::shared_ptr<pbrt::syntactic::Film>::shared_ptr((shared_ptr<pbrt::syntactic::Film> *)0x15f4fd);
  std::shared_ptr<pbrt::syntactic::Sampler>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Sampler> *)0x15f510);
  std::shared_ptr<pbrt::syntactic::Integrator>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Integrator> *)0x15f523);
  std::shared_ptr<pbrt::syntactic::VolumeIntegrator>::shared_ptr
            ((shared_ptr<pbrt::syntactic::VolumeIntegrator> *)0x15f536);
  std::shared_ptr<pbrt::syntactic::SurfaceIntegrator>::shared_ptr
            ((shared_ptr<pbrt::syntactic::SurfaceIntegrator> *)0x15f549);
  __args = (char (*) [7])(in_RDI + 0xe);
  std::shared_ptr<pbrt::syntactic::PixelFilter>::shared_ptr
            ((shared_ptr<pbrt::syntactic::PixelFilter> *)0x15f55c);
  std::make_shared<pbrt::syntactic::Object,char_const(&)[7]>(__args);
  std::__cxx11::string::string((string *)(in_RDI + 0x12));
  return;
}

Assistant:

Scene()
        : world(std::make_shared<Object>("<root>"))
      {}